

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

void LenEnc_Init(CLenEnc *p)

{
  uint i;
  CLenEnc *p_local;
  
  p->choice2 = 0x400;
  p->choice = 0x400;
  for (i = 0; i < 0x80; i = i + 1) {
    p->low[i] = 0x400;
  }
  for (i = 0; i < 0x80; i = i + 1) {
    p->mid[i] = 0x400;
  }
  for (i = 0; i < 0x100; i = i + 1) {
    p->high[i] = 0x400;
  }
  return;
}

Assistant:

static void LenEnc_Init(CLenEnc *p)
{
  unsigned i;
  p->choice = p->choice2 = kProbInitValue;
  for (i = 0; i < (LZMA_NUM_PB_STATES_MAX << kLenNumLowBits); i++)
    p->low[i] = kProbInitValue;
  for (i = 0; i < (LZMA_NUM_PB_STATES_MAX << kLenNumMidBits); i++)
    p->mid[i] = kProbInitValue;
  for (i = 0; i < kLenNumHighSymbols; i++)
    p->high[i] = kProbInitValue;
}